

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestPartResult
          (StreamingListener *this,TestPartResult *test_part_result)

{
  StreamingListener *this_00;
  char *str;
  char *str_00;
  string local_138;
  int local_114;
  string local_110;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  StreamingListener *local_20;
  char *file_name;
  TestPartResult *test_part_result_local;
  StreamingListener *this_local;
  
  file_name = (char *)test_part_result;
  test_part_result_local = (TestPartResult *)this;
  local_20 = (StreamingListener *)TestPartResult::file_name(test_part_result);
  if (local_20 == (StreamingListener *)0x0) {
    local_20 = (StreamingListener *)0x181f9a;
  }
  UrlEncode_abi_cxx11_(&local_e0,local_20,str);
  std::operator+(&local_c0,"event=TestPartResult&file=",&local_e0);
  std::operator+(&local_a0,&local_c0,"&line=");
  local_114 = TestPartResult::line_number((TestPartResult *)file_name);
  StreamableToString<int>(&local_110,&local_114);
  std::operator+(&local_80,&local_a0,&local_110);
  std::operator+(&local_60,&local_80,"&message=");
  this_00 = (StreamingListener *)TestPartResult::message((TestPartResult *)file_name);
  UrlEncode_abi_cxx11_(&local_138,this_00,str_00);
  std::operator+(&local_40,&local_60,&local_138);
  SendLn(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

void OnTestPartResult(const TestPartResult& test_part_result) {
    const char* file_name = test_part_result.file_name();
    if (file_name == NULL)
      file_name = "";
    SendLn("event=TestPartResult&file=" + UrlEncode(file_name) +
           "&line=" + StreamableToString(test_part_result.line_number()) +
           "&message=" + UrlEncode(test_part_result.message()));
  }